

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_process_table_row
              (MD_CTX *ctx,MD_BLOCKTYPE cell_type,MD_OFFSET beg,MD_OFFSET end,MD_ALIGN *align,
              int col_count)

{
  MD_OFFSET beg_00;
  MD_ALIGN align_00;
  int in_ECX;
  undefined4 in_EDX;
  int iVar1;
  long in_RDI;
  int in_R9D;
  MD_MARK *mark;
  int ret;
  int n;
  int k;
  int j;
  int i;
  MD_OFFSET *pipe_offs;
  MD_LINE line;
  undefined8 in_stack_ffffffffffffffa8;
  MD_OFFSET in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  MD_BLOCKTYPE cell_type_00;
  int iVar2;
  undefined4 *local_38;
  
  local_38 = (undefined4 *)0x0;
  beg_00 = md_analyze_inlines((MD_CTX *)
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                              (MD_LINE *)(ulong)in_stack_ffffffffffffffb0,
                              (MD_SIZE)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                              (int)in_stack_ffffffffffffffa8);
  if (-1 < (int)beg_00) {
    align_00 = *(int *)(in_RDI + 0x1e4) + MD_ALIGN_CENTER;
    local_38 = (undefined4 *)malloc((long)(int)align_00 << 2);
    if (local_38 == (undefined4 *)0x0) {
      if (*(long *)(in_RDI + 0x40) != 0) {
        (**(code **)(in_RDI + 0x40))("malloc() failed.",*(undefined8 *)(in_RDI + 0x50));
      }
      beg_00 = 0xffffffff;
    }
    else {
      *local_38 = in_EDX;
      iVar2 = 1;
      for (iVar1 = *(int *)(in_RDI + 0x1e8); -1 < iVar1;
          iVar1 = *(int *)(*(long *)(in_RDI + 0x90) + (long)iVar1 * 0x14 + 0xc)) {
        local_38[iVar2] = *(undefined4 *)(*(long *)(in_RDI + 0x90) + (long)iVar1 * 0x14 + 4);
        iVar2 = iVar2 + 1;
      }
      iVar1 = iVar2 + 1;
      local_38[iVar2] = in_ECX + 1;
      beg_00 = (**(code **)(in_RDI + 0x18))(0xd,0,*(undefined8 *)(in_RDI + 0x50));
      if (beg_00 == 0) {
        cell_type_00 = MD_BLOCK_DOC;
        beg_00 = 0;
        for (iVar2 = 0; iVar2 < iVar1 + -1 && (int)cell_type_00 < in_R9D; iVar2 = iVar2 + 1) {
          if ((uint)local_38[iVar2] < local_38[iVar2 + 1] - 1) {
            cell_type_00 = cell_type_00 + MD_BLOCK_QUOTE;
            beg_00 = md_process_table_cell
                               ((MD_CTX *)CONCAT44(iVar2,iVar1),cell_type_00,align_00,beg_00,
                                in_stack_ffffffffffffffb0);
            if ((int)beg_00 < 0) goto LAB_0010cc2f;
          }
        }
        do {
          if (in_R9D <= (int)cell_type_00) {
            beg_00 = (**(code **)(in_RDI + 0x20))(0xd,0,*(undefined8 *)(in_RDI + 0x50));
            if ((beg_00 != 0) && (*(long *)(in_RDI + 0x40) != 0)) {
              (**(code **)(in_RDI + 0x40))
                        ("Aborted from leave_block() callback.",*(undefined8 *)(in_RDI + 0x50));
            }
            break;
          }
          cell_type_00 = cell_type_00 + MD_BLOCK_QUOTE;
          beg_00 = md_process_table_cell
                             ((MD_CTX *)CONCAT44(iVar2,iVar1),cell_type_00,align_00,beg_00,
                              in_stack_ffffffffffffffb0);
        } while (-1 < (int)beg_00);
      }
      else if (*(long *)(in_RDI + 0x40) != 0) {
        (**(code **)(in_RDI + 0x40))
                  ("Aborted from enter_block() callback.",*(undefined8 *)(in_RDI + 0x50));
      }
    }
  }
LAB_0010cc2f:
  free(local_38);
  *(undefined4 *)(in_RDI + 0x1e8) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x1ec) = 0xffffffff;
  return beg_00;
}

Assistant:

static int
md_process_table_row(MD_CTX* ctx, MD_BLOCKTYPE cell_type, OFF beg, OFF end,
                     const MD_ALIGN* align, int col_count)
{
    MD_LINE line;
    OFF* pipe_offs = NULL;
    int i, j, k, n;
    int ret = 0;

    line.beg = beg;
    line.end = end;

    /* Break the line into table cells by identifying pipe characters who
     * form the cell boundary. */
    MD_CHECK(md_analyze_inlines(ctx, &line, 1, TRUE));

    /* We have to remember the cell boundaries in local buffer because
     * ctx->marks[] shall be reused during cell contents processing. */
    n = ctx->n_table_cell_boundaries + 2;
    pipe_offs = (OFF*) malloc(n * sizeof(OFF));
    if(pipe_offs == NULL) {
        MD_LOG("malloc() failed.");
        ret = -1;
        goto abort;
    }
    j = 0;
    pipe_offs[j++] = beg;
    for(i = ctx->table_cell_boundaries_head; i >= 0; i = ctx->marks[i].next) {
        MD_MARK* mark = &ctx->marks[i];
        pipe_offs[j++] = mark->end;
    }
    pipe_offs[j++] = end+1;

    /* Process cells. */
    MD_ENTER_BLOCK(MD_BLOCK_TR, NULL);
    k = 0;
    for(i = 0; i < j-1  &&  k < col_count; i++) {
        if(pipe_offs[i] < pipe_offs[i+1]-1)
            MD_CHECK(md_process_table_cell(ctx, cell_type, align[k++], pipe_offs[i], pipe_offs[i+1]-1));
    }
    /* Make sure we call enough table cells even if the current table contains
     * too few of them. */
    while(k < col_count)
        MD_CHECK(md_process_table_cell(ctx, cell_type, align[k++], 0, 0));
    MD_LEAVE_BLOCK(MD_BLOCK_TR, NULL);

abort:
    free(pipe_offs);

    ctx->table_cell_boundaries_head = -1;
    ctx->table_cell_boundaries_tail = -1;

    return ret;
}